

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

bool spvtools::opt::analysis::CompareAndPrintDifferences(DefUseManager *lhs,DefUseManager *rhs)

{
  bool bVar1;
  reference pvVar2;
  reference pUVar3;
  size_type sVar4;
  reference pvVar5;
  size_type sVar6;
  undefined1 local_150 [8];
  value_type p_5;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  InstToUsedIdsMap *__range3_5;
  value_type p_4;
  const_iterator __end3_4;
  const_iterator __begin3_4;
  InstToUsedIdsMap *__range3_4;
  UserEntry p_3;
  iterator __end3_3;
  iterator __begin3_3;
  IdToUsersMap *__range3_3;
  UserEntry p_2;
  iterator __end3_2;
  iterator __begin3_2;
  IdToUsersMap *__range3_2;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_88;
  undefined8 local_80;
  value_type p_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  IdToDefMap *__range3_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_50;
  undefined8 local_48;
  value_type p;
  const_iterator __end3;
  const_iterator __begin3;
  IdToDefMap *__range3;
  bool same;
  DefUseManager *rhs_local;
  DefUseManager *lhs_local;
  
  __range3._7_1_ = true;
  bVar1 = std::operator!=(&lhs->id_to_def_,&rhs->id_to_def_);
  if (bVar1) {
    __end3 = std::
             unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
             ::begin(&lhs->id_to_def_);
    p.second = (Instruction *)
               std::
               unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
               ::end(&lhs->id_to_def_);
    while (bVar1 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                                *)&p.second), bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
               ::operator*(&__end3);
      local_48 = *(undefined8 *)pvVar2;
      p._0_8_ = pvVar2->second;
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
           ::find(&rhs->id_to_def_,(key_type *)&local_48);
      __range3_1 = (IdToDefMap *)
                   std::
                   unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                   ::end(&rhs->id_to_def_);
      bVar1 = std::__detail::operator==
                        (&local_50,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                          *)&__range3_1);
      if (bVar1) {
        printf("Diff in id_to_def: missing value in rhs\n");
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
      ::operator++(&__end3);
    }
    __end3_1 = std::
               unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
               ::begin(&rhs->id_to_def_);
    p_1.second = (Instruction *)
                 std::
                 unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                 ::end(&rhs->id_to_def_);
    while (bVar1 = std::__detail::operator!=
                             (&__end3_1.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                                *)&p_1.second), bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
               ::operator*(&__end3_1);
      local_80 = *(undefined8 *)pvVar2;
      p_1._0_8_ = pvVar2->second;
      local_88._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
           ::find(&lhs->id_to_def_,(key_type *)&local_80);
      __range3_2 = (IdToUsersMap *)
                   std::
                   unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                   ::end(&lhs->id_to_def_);
      bVar1 = std::__detail::operator==
                        (&local_88,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                          *)&__range3_2);
      if (bVar1) {
        printf("Diff in id_to_def: missing value in lhs\n");
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
      ::operator++(&__end3_1);
    }
    __range3._7_1_ = false;
  }
  bVar1 = std::operator!=(&lhs->id_to_users_,&rhs->id_to_users_);
  if (bVar1) {
    __end3_2 = std::
               set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
               ::begin(&lhs->id_to_users_);
    p_2.user = (Instruction *)
               std::
               set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
               ::end(&lhs->id_to_users_);
    while (bVar1 = std::operator!=(&__end3_2,(_Self *)&p_2.user), bVar1) {
      pUVar3 = std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>::operator*
                         (&__end3_2);
      __range3_3 = (IdToUsersMap *)pUVar3->def;
      p_2.def = pUVar3->user;
      sVar4 = std::
              set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
              ::count(&rhs->id_to_users_,(key_type *)&__range3_3);
      if (sVar4 == 0) {
        printf("Diff in id_to_users: missing value in rhs\n");
      }
      std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>::operator++(&__end3_2);
    }
    __end3_3 = std::
               set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
               ::begin(&rhs->id_to_users_);
    p_3.user = (Instruction *)
               std::
               set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
               ::end(&rhs->id_to_users_);
    while (bVar1 = std::operator!=(&__end3_3,(_Self *)&p_3.user), bVar1) {
      pUVar3 = std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>::operator*
                         (&__end3_3);
      __range3_4 = (InstToUsedIdsMap *)pUVar3->def;
      p_3.def = pUVar3->user;
      sVar4 = std::
              set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
              ::count(&lhs->id_to_users_,(key_type *)&__range3_4);
      if (sVar4 == 0) {
        printf("Diff in id_to_users: missing value in lhs\n");
      }
      std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>::operator++(&__end3_3);
    }
    __range3._7_1_ = false;
  }
  bVar1 = std::operator!=(&lhs->inst_to_used_ids_,&rhs->inst_to_used_ids_);
  if (bVar1) {
    __end3_4 = std::
               unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::begin(&lhs->inst_to_used_ids_);
    p_4.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::end(&lhs->inst_to_used_ids_);
    while (bVar1 = std::__detail::operator!=
                             (&__end3_4.
                               super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                              ,(_Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                                *)&p_4.second.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
               ::operator*(&__end3_4);
      std::
      pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::pair((pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)&__range3_5,pvVar5);
      sVar6 = std::
              unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::count(&rhs->inst_to_used_ids_,(key_type *)&__range3_5);
      if (sVar6 == 0) {
        printf("Diff in inst_to_used_ids: missing value in rhs\n");
      }
      std::
      pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::~pair((pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               *)&__range3_5);
      std::__detail::
      _Node_const_iterator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
      ::operator++(&__end3_4);
    }
    __end3_5 = std::
               unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::begin(&rhs->inst_to_used_ids_);
    p_5.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::end(&rhs->inst_to_used_ids_);
    while (bVar1 = std::__detail::operator!=
                             (&__end3_5.
                               super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                              ,(_Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                                *)&p_5.second.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
               ::operator*(&__end3_5);
      std::
      pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::pair((pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)local_150,pvVar5);
      sVar6 = std::
              unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::count(&lhs->inst_to_used_ids_,(key_type *)local_150);
      if (sVar6 == 0) {
        printf("Diff in inst_to_used_ids: missing value in lhs\n");
      }
      std::
      pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::~pair((pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               *)local_150);
      std::__detail::
      _Node_const_iterator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
      ::operator++(&__end3_5);
    }
    __range3._7_1_ = false;
  }
  return __range3._7_1_;
}

Assistant:

bool CompareAndPrintDifferences(const DefUseManager& lhs,
                                const DefUseManager& rhs) {
  bool same = true;

  if (lhs.id_to_def_ != rhs.id_to_def_) {
    for (auto p : lhs.id_to_def_) {
      if (rhs.id_to_def_.find(p.first) == rhs.id_to_def_.end()) {
        printf("Diff in id_to_def: missing value in rhs\n");
      }
    }
    for (auto p : rhs.id_to_def_) {
      if (lhs.id_to_def_.find(p.first) == lhs.id_to_def_.end()) {
        printf("Diff in id_to_def: missing value in lhs\n");
      }
    }
    same = false;
  }

  if (lhs.id_to_users_ != rhs.id_to_users_) {
    for (auto p : lhs.id_to_users_) {
      if (rhs.id_to_users_.count(p) == 0) {
        printf("Diff in id_to_users: missing value in rhs\n");
      }
    }
    for (auto p : rhs.id_to_users_) {
      if (lhs.id_to_users_.count(p) == 0) {
        printf("Diff in id_to_users: missing value in lhs\n");
      }
    }
    same = false;
  }

  if (lhs.inst_to_used_ids_ != rhs.inst_to_used_ids_) {
    for (auto p : lhs.inst_to_used_ids_) {
      if (rhs.inst_to_used_ids_.count(p.first) == 0) {
        printf("Diff in inst_to_used_ids: missing value in rhs\n");
      }
    }
    for (auto p : rhs.inst_to_used_ids_) {
      if (lhs.inst_to_used_ids_.count(p.first) == 0) {
        printf("Diff in inst_to_used_ids: missing value in lhs\n");
      }
    }
    same = false;
  }

  return same;
}